

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O1

void get_mac(byte *buffer,int nbits,byte *out)

{
  ulong uVar1;
  byte bVar2;
  
  if (nbits >> 3 < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      out[uVar1] = buffer[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)(nbits >> 3) != uVar1);
  }
  if ((nbits & 7U) != 0) {
    bVar2 = buffer[uVar1];
    if ((nbits & 7U) != 1) {
      bVar2 = '\0';
    }
    out[uVar1] = bVar2;
  }
  return;
}

Assistant:

void get_mac(byte * buffer, int nbits, byte * out)
{
    int nbytes = nbits >> 3;
    int rembits = nbits & 7;
    int mask = rembits ? ((1 < rembits) - 1) : 0;
    int i;
    for (i = 0; i < nbytes; i++)
        out[i] = buffer[i];
    if (rembits)
        out[i] = buffer[i] & mask;
}